

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugWriter.cpp
# Opt level: O1

void __thiscall UnifiedRegex::DebugWriter::PrintEscapedChar(DebugWriter *this,Char c)

{
  if (this->nlPending == true) {
    Output::Print(L"\n%*s",(ulong)(uint)(this->indent << 2),L"");
    this->nlPending = false;
  }
  if (0xff < (ushort)c) {
    Output::Print(L"\\u%lc%lc%lc%lc",(ulong)(ushort)L"0123456789abcdef"[(ushort)c >> 0xc],
                  (ulong)*(ushort *)((long)L"0123456789abcdef" + (ulong)((ushort)c >> 7 & 0x1e)),
                  (ulong)*(ushort *)((long)L"0123456789abcdef" + (ulong)((ushort)c >> 3 & 0x1e)),
                  (ulong)(ushort)L"0123456789abcdef"[(ushort)c & 0xf]);
    return;
  }
  if (c == L'-') {
    Output::Print(L"\\x2d");
    return;
  }
  if ((ushort)(c + L'ﾁ') < 0xffa1) {
    Output::Print(L"\\x%lc%lc",(ulong)(ushort)L"0123456789abcdef"[(ushort)c >> 4],
                  (ulong)(ushort)L"0123456789abcdef"[(ushort)c & 0xf]);
    return;
  }
  Output::Print(L"%lc");
  return;
}

Assistant:

void DebugWriter::PrintEscapedChar(const Char c)
    {
        CheckForNewline();
        if (c > 0xff)
            Output::Print(_u("\\u%lc%lc%lc%lc"), hex[c >> 12], hex[(c >> 8) & 0xf], hex[(c >> 4) & 0xf], hex[c & 0xf]);
        else if (c == '-')
            Output::Print(_u("\\x2d"));
        else if (c < ' ' || c > '~')
            Output::Print(_u("\\x%lc%lc"), hex[c >> 4], hex[c & 0xf]);
        else
            Output::Print(_u("%lc"), c);
    }